

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O0

void __thiscall
Liby::PollerPoll::updateChanel(PollerPoll *this,Channel *ch,bool readable,bool writable)

{
  int iVar1;
  reference pvVar2;
  bool bVar3;
  pollfd *p;
  int fd;
  bool writable_local;
  bool readable_local;
  Channel *ch_local;
  PollerPoll *this_local;
  
  bVar3 = false;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar3 = -1 < iVar1;
  }
  if (!bVar3) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp"
                  ,0x21,"virtual void Liby::PollerPoll::updateChanel(Channel *, bool, bool)");
  }
  iVar1 = Channel::get_fd(ch);
  pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->pollfds_,(long)iVar1);
  if (readable) {
    pvVar2->events = pvVar2->events | 1;
  }
  else {
    pvVar2->events = pvVar2->events & 0xfffe;
  }
  if (writable) {
    pvVar2->events = pvVar2->events | 4;
  }
  else {
    pvVar2->events = pvVar2->events & 0xfffb;
  }
  return;
}

Assistant:

void PollerPoll::updateChanel(Channel *ch, bool readable, bool writable) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    struct pollfd *p = &pollfds_[fd];

    if (readable) {
        p->events |= POLLIN;
    } else {
        p->events &= ~POLLIN;
    }

    if (writable) {
        p->events |= POLLOUT;
    } else {
        p->events &= ~POLLOUT;
    }
}